

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_2266dc9::IFFT2DTest::SetUp(IFFT2DTest *this)

{
  size_t size;
  undefined8 *puVar1;
  ParamType *pPVar2;
  float *pfVar3;
  SEARCH_METHODS *pSVar4;
  long lVar5;
  size_t size_00;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  AssertHelper local_48;
  internal local_40 [8];
  undefined8 *local_38;
  
  pPVar2 = testing::WithParamInterface<(anonymous_namespace)::IFFTTestArg>::GetParam();
  lVar5 = (long)pPVar2->n * (long)pPVar2->n;
  size = lVar5 * 4;
  size_00 = lVar5 * 8;
  pfVar3 = (float *)aom_memalign(0x20,size_00);
  this->input_ = pfVar3;
  pfVar3 = (float *)aom_memalign(0x20,size_00);
  this->temp_ = pfVar3;
  pfVar3 = (float *)aom_memalign(0x20,size);
  this->output_ = pfVar3;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<float*,decltype(nullptr)>
            (local_40,"input_","nullptr",&this->input_,&local_50._M_head_impl);
  puVar1 = local_38;
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = (SEARCH_METHODS *)*local_38;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/fft_test.cc"
               ,0xba,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
  }
  else {
    if (local_38 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_38 != local_38 + 2) {
        operator_delete((undefined8 *)*local_38);
      }
      operator_delete(puVar1);
    }
    local_50._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<float*,decltype(nullptr)>
              (local_40,"temp_","nullptr",&this->temp_,&local_50._M_head_impl);
    puVar1 = local_38;
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_38 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_38;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/fft_test.cc"
                 ,0xbb,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    }
    else {
      if (local_38 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_38 != local_38 + 2) {
          operator_delete((undefined8 *)*local_38);
        }
        operator_delete(puVar1);
      }
      local_50._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::CmpHelperNE<float*,decltype(nullptr)>
                (local_40,"output_","nullptr",&this->output_,&local_50._M_head_impl);
      if (local_40[0] != (internal)0x0) {
        if (local_38 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_38 != local_38 + 2) {
            operator_delete((undefined8 *)*local_38);
          }
          operator_delete(local_38);
        }
        memset(this->input_,0,size_00);
        memset(this->temp_,0,size_00);
        memset(this->output_,0,size);
        return;
      }
      testing::Message::Message((Message *)&local_50);
      if (local_38 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_38;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/fft_test.cc"
                 ,0xbc,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if (local_50._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_50._M_head_impl + 8))();
  }
  if (local_38 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_38 != local_38 + 2) {
      operator_delete((undefined8 *)*local_38);
    }
    operator_delete(local_38);
  }
  return;
}

Assistant:

void SetUp() override {
    int n = GetParam().n;
    input_ = (float *)aom_memalign(32, sizeof(*input_) * n * n * 2);
    temp_ = (float *)aom_memalign(32, sizeof(*temp_) * n * n * 2);
    output_ = (float *)aom_memalign(32, sizeof(*output_) * n * n);
    ASSERT_NE(input_, nullptr);
    ASSERT_NE(temp_, nullptr);
    ASSERT_NE(output_, nullptr);
    memset(input_, 0, sizeof(*input_) * n * n * 2);
    memset(temp_, 0, sizeof(*temp_) * n * n * 2);
    memset(output_, 0, sizeof(*output_) * n * n);
  }